

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ConfigLiblistSyntax::setChild
          (ConfigLiblistSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *this_00;
  long in_RSI;
  long in_RDI;
  Token TVar1;
  TokenList *in_stack_ffffffffffffffc8;
  TokenList *this_01;
  undefined8 local_20;
  Info *local_18;
  
  this_01 = (TokenList *)&stack0x00000008;
  if (in_RSI == 0) {
    TVar1 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)in_stack_ffffffffffffffc8);
    local_20 = TVar1._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar1.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else {
    this_00 = TokenOrSyntax::node((TokenOrSyntax *)0x6c124a);
    SyntaxNode::as<slang::syntax::TokenList>(this_00);
    TokenList::operator=(this_01,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void ConfigLiblistSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: liblist = child.token(); return;
        case 1: libraries = child.node()->as<TokenList>(); return;
        default: SLANG_UNREACHABLE;
    }
}